

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

size_t __thiscall re2::DFA::StateHash::operator()(StateHash *this,State *a)

{
  uint32 x;
  undefined8 local_18;
  
  if (a != (State *)0x0) {
    local_18 = (ulong)a->flag_ << 0x20;
    hashword2((uint32 *)a->inst_,(long)((ulong)(uint)a->ninst_ << 0x22) >> 0x22,
              (uint32 *)((long)&local_18 + 4),(uint32 *)&local_18);
    return local_18;
  }
  return 0;
}

Assistant:

size_t operator()(const State* a) const {
      if (a == NULL)
        return 0;
      const char* s = reinterpret_cast<const char*>(a->inst_);
      int len = a->ninst_ * sizeof a->inst_[0];
      if (sizeof(size_t) == sizeof(uint32))
        return Hash32StringWithSeed(s, len, a->flag_);
      else
        return static_cast<size_t>(Hash64StringWithSeed(s, len, a->flag_));
    }